

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportFileGenerator::AddTargetNamespace
          (cmExportFileGenerator *this,string *input,cmGeneratorTarget *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  bool bVar1;
  ulong uVar2;
  string local_c0 [8];
  string namespacedTarget;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Self local_50;
  _Self local_48;
  cmGeneratorTarget *local_40;
  cmGeneratorTarget *tgt;
  cmLocalGenerator *lg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingTargets_local;
  cmGeneratorTarget *target_local;
  string *input_local;
  cmExportFileGenerator *this_local;
  
  lg = (cmLocalGenerator *)missingTargets;
  missingTargets_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)target;
  target_local = (cmGeneratorTarget *)input;
  input_local = (string *)this;
  tgt = (cmGeneratorTarget *)cmGeneratorTarget::GetLocalGenerator(target);
  local_40 = cmLocalGenerator::FindGeneratorTargetToUse
                       ((cmLocalGenerator *)tgt,(string *)target_local);
  if (local_40 == (cmGeneratorTarget *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = cmGeneratorTarget::IsImported(local_40);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      local_48._M_node =
           (_Base_ptr)
           std::
           set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
           ::find(&this->ExportedTargets,&local_40);
      local_50._M_node =
           (_Base_ptr)
           std::
           set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
           ::end(&this->ExportedTargets);
      bVar1 = std::operator!=(&local_48,&local_50);
      if (bVar1) {
        cmGeneratorTarget::GetExportName_abi_cxx11_(&local_90,local_40);
        std::operator+(&local_70,&this->Namespace,&local_90);
        std::__cxx11::string::operator=((string *)target_local,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        std::__cxx11::string::string(local_c0);
        (*this->_vptr_cmExportFileGenerator[4])(this,local_c0,lg,missingTargets_local,local_40);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          std::__cxx11::string::operator=((string *)target_local,local_c0);
        }
        std::__cxx11::string::~string(local_c0);
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
cmExportFileGenerator::AddTargetNamespace(std::string &input,
                                    cmGeneratorTarget* target,
                                    std::vector<std::string> &missingTargets)
{
  cmLocalGenerator *lg = target->GetLocalGenerator();

  cmGeneratorTarget *tgt = lg->FindGeneratorTargetToUse(input);
  if (!tgt)
    {
    return false;
    }

  if(tgt->IsImported())
    {
    return true;
    }
  if(this->ExportedTargets.find(tgt) != this->ExportedTargets.end())
    {
    input = this->Namespace + tgt->GetExportName();
    }
  else
    {
    std::string namespacedTarget;
    this->HandleMissingTarget(namespacedTarget, missingTargets,
                              target, tgt);
    if (!namespacedTarget.empty())
      {
      input = namespacedTarget;
      }
    }
  return true;
}